

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O0

void __thiscall
FluxTrackBuilder::FluxTrackBuilder
          (FluxTrackBuilder *this,CylHead *cylhead,DataRate datarate,Encoding encoding)

{
  uint32_t uVar1;
  Encoding encoding_local;
  DataRate datarate_local;
  CylHead *cylhead_local;
  FluxTrackBuilder *this_local;
  
  TrackBuilder::TrackBuilder(&this->super_TrackBuilder,datarate,encoding);
  (this->super_TrackBuilder)._vptr_TrackBuilder = (_func_int **)&PTR__FluxTrackBuilder_003023c8;
  *(CylHead *)&(this->super_TrackBuilder).field_0x14 = *cylhead;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_flux_times);
  uVar1 = bitcell_ns(datarate);
  this->m_bitcell_ns = uVar1;
  this->m_flux_time = -this->m_bitcell_ns;
  this->m_last_bit = false;
  this->m_curr_bit = false;
  return;
}

Assistant:

FluxTrackBuilder::FluxTrackBuilder(const CylHead& cylhead, DataRate datarate, Encoding encoding)
    : TrackBuilder(datarate, encoding),
    m_cylhead(cylhead), m_bitcell_ns(bitcell_ns(datarate)),
    m_flux_time(0U - m_bitcell_ns)
{
    // We start with a negative cell time to absorb the first zero m_cur_bit.
    // This ensures the first reversal exactly matches the added data.
}